

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_unregister_works_with_different_object_Test::TestBody
          (SubjectSetRegisterTest_test_unregister_works_with_different_object_Test *this)

{
  byte bVar1;
  char *in_R9;
  AssertHelper AStack_128;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  string local_118;
  AssertionResult gtest_ar_;
  Subject subject2;
  Subject subject1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  SubjectSetRegister subject_register;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(&subject_register);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR,BuySideId=1A78668,Level=1,NumAllocs=1,Symbol=EURGBP,Quantity=1000000.00,RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109"
             ,(allocator<char> *)&subject2);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&subject1);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,
             "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR,BuySideId=1A78668,Level=1,NumAllocs=1,Symbol=EURGBP,Quantity=1000000.00,RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109"
             ,(allocator<char> *)&gtest_ar_);
  bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString((string *)&subject2);
  std::__cxx11::string::~string((string *)&local_118);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&subject_register);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x19f,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&subject_register);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a0,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_b8,&subject1);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(&subject_register,&local_b8,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  gtest_ar_.success_ =
       (bool)bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                       ((Subject *)&subject_register);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a2,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ =
       (bool)bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                       ((Subject *)&subject_register);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a3,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bidfx_public_api::price::pixie::SubjectSetRegister::Unregister((Subject *)&subject_register);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&subject_register);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject1)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a5,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  bVar1 = bidfx_public_api::price::pixie::SubjectSetRegister::IsCurrentlySubscribed
                    ((Subject *)&subject_register);
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message((Message *)&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_118,(internal *)&gtest_ar_,
               (AssertionResult *)"subject_register.IsCurrentlySubscribed(subject2)","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x1a6,local_118._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_128,(Message *)&local_120);
    testing::internal::AssertHelper::~AssertHelper(&AStack_128);
    std::__cxx11::string::~string((string *)&local_118);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_120);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subject2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&subject1);
  SubjectSetRegister::~SubjectSetRegister(&subject_register);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_unregister_works_with_different_object)
{
    SubjectSetRegister subject_register = SubjectSetRegister();

    const Subject subject1 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");

    const Subject subject2 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");


    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Register(subject1, false);
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Unregister(subject2);
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
}